

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadhash.cpp
# Opt level: O1

uint64_t MurmurHash64A(void *key,int len,uint64_t seed)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  
  uVar4 = (long)len * -0x395b586ca42e166b ^ seed;
  uVar2 = len;
  if (len < 0) {
    uVar2 = len + 7U;
  }
  if (0xe < len + 7U) {
    lVar3 = (long)((int)uVar2 >> 3) << 3;
    do {
      lVar1 = *key;
      key = (void *)((long)key + 8);
      uVar4 = (((ulong)(lVar1 * -0x395b586ca42e166b) >> 0x2f ^ lVar1 * -0x395b586ca42e166b) *
               -0x395b586ca42e166b ^ uVar4) * -0x395b586ca42e166b;
      lVar3 = lVar3 + -8;
    } while (lVar3 != 0);
  }
  switch(len & 7) {
  case 7:
    uVar4 = uVar4 ^ (ulong)*(byte *)((long)key + 6) << 0x30;
  case 6:
    uVar4 = uVar4 ^ (ulong)*(byte *)((long)key + 5) << 0x28;
  case 5:
    uVar4 = uVar4 ^ (ulong)*(byte *)((long)key + 4) << 0x20;
  case 4:
    uVar4 = uVar4 ^ (ulong)*(byte *)((long)key + 3) << 0x18;
  case 3:
    uVar4 = uVar4 ^ (ulong)*(byte *)((long)key + 2) << 0x10;
  case 2:
    uVar4 = uVar4 ^ (ulong)*(byte *)((long)key + 1) << 8;
  case 1:
    uVar4 = (*key ^ uVar4) * -0x395b586ca42e166b;
  case 0:
    uVar4 = (uVar4 >> 0x2f ^ uVar4) * -0x395b586ca42e166b;
    return uVar4 >> 0x2f ^ uVar4;
  }
}

Assistant:

uint64_t MurmurHash64A(const void* key, int len, uint64_t seed)
{
	const uint64_t m = BIG_CONSTANT(0xc6a4a7935bd1e995);
	const int r = 47;

	uint64_t h = seed ^ (len * m);

	const uint64_t* data = (const uint64_t*)key;
	const uint64_t* end = data + (len / 8);

	while (data != end)
	{
		uint64_t k = *data++;

		k *= m;
		k ^= k >> r;
		k *= m;

		h ^= k;
		h *= m;
	}

	const unsigned char* data2 = (const unsigned char*)data;

	switch (len & 7)
	{
	case 7: h ^= (uint64_t)(data2[6]) << 48;
	case 6: h ^= (uint64_t)(data2[5]) << 40;
	case 5: h ^= (uint64_t)(data2[4]) << 32;
	case 4: h ^= (uint64_t)(data2[3]) << 24;
	case 3: h ^= (uint64_t)(data2[2]) << 16;
	case 2: h ^= (uint64_t)(data2[1]) << 8;
	case 1: h ^= (uint64_t)(data2[0]);
		h *= m;
	};

	h ^= h >> r;
	h *= m;
	h ^= h >> r;

	return h;
}